

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::generate_property
          (t_netstd_generator *this,ostream *out,t_field *tfield,bool isPublic,bool generateIsset)

{
  allocator local_51;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"_",&local_51);
  generate_netstd_property(this,out,tfield,isPublic,generateIsset,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void t_netstd_generator::generate_property(ostream& out, t_field* tfield, bool isPublic, bool generateIsset)
{
    generate_netstd_property(out, tfield, isPublic, generateIsset, "_");
}